

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

ssize_t __thiscall asl::Socket_::read(Socket_ *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  int n;
  int size0;
  int s;
  int size_local;
  void *data_local;
  Socket_ *this_local;
  
  _s = (void *)CONCAT44(in_register_00000034,__fd);
  n = 0;
  size0 = (int)__buf;
  while( true ) {
    sVar1 = ::read(*(int *)&(this->super_SmartObject_).field_0xc,_s,(long)size0);
    this_local._4_4_ = (uint)sVar1;
    if ((this->_blocking & 1U) == 0) goto LAB_00138f08;
    if ((int)this_local._4_4_ < 1) break;
    _s = (void *)((long)_s + (long)(int)this_local._4_4_);
    n = this_local._4_4_ + n;
    size0 = size0 - this_local._4_4_;
    if ((int)__buf <= n) {
LAB_00138f02:
      this_local._4_4_ = n;
LAB_00138f08:
      return (ulong)this_local._4_4_;
    }
  }
  this->_error = 5;
  goto LAB_00138f02;
}

Assistant:

int Socket_::read(void* data, int size)
{
		int s = 0, size0 = size;
		do
		{
#ifdef _WIN32
		int n = recv(_handle, (char*)data, size, 0);
#else
		int n = ::read(_handle, (char*)data, size);
#endif
		if (!_blocking)
			return n;
			if (n <= 0)
			{
			_error = SOCKET_BAD_RECV;
			break;
		}
		data = (char*)data + n;
		s += n;
		size -= n;
		} while (s < size0);
	return s;
	}